

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * flatbuffers::RelativeToRootPath
                   (string *__return_storage_ptr__,string *project,string *filepath)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *path;
  char *path_00;
  long lVar4;
  string local_80;
  string absolute_filepath;
  string absolute_project;
  
  AbsolutePath(&absolute_filepath,project);
  PosixPath_abi_cxx11_(&absolute_project,(flatbuffers *)absolute_filepath._M_dataplus._M_p,path);
  std::__cxx11::string::~string((string *)&absolute_filepath);
  if (absolute_project._M_dataplus._M_p[absolute_project._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&absolute_project);
  }
  AbsolutePath(&local_80,filepath);
  PosixPath_abi_cxx11_(&absolute_filepath,(flatbuffers *)local_80._M_dataplus._M_p,path_00);
  std::__cxx11::string::~string((string *)&local_80);
  lVar4 = 0;
  for (lVar3 = 0;
      (cVar1 = absolute_project._M_dataplus._M_p[lVar3], cVar1 != '\0' &&
      (cVar1 == absolute_filepath._M_dataplus._M_p[lVar3])); lVar3 = lVar3 + 1) {
    if (cVar1 == '/') {
      lVar4 = lVar3;
    }
  }
  lVar3 = 0;
  for (pcVar2 = absolute_project._M_dataplus._M_p + lVar4; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
    lVar3 = lVar3 + (ulong)(*pcVar2 == '/');
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"//",(allocator<char> *)&local_80);
  while (lVar3 = lVar3 + -1, lVar3 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::substr((ulong)&local_80,(ulong)&absolute_filepath);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&absolute_filepath);
  std::__cxx11::string::~string((string *)&absolute_project);
  return __return_storage_ptr__;
}

Assistant:

std::string RelativeToRootPath(const std::string &project,
                               const std::string &filepath) {
  std::string absolute_project = PosixPath(AbsolutePath(project));
  if (absolute_project.back() != '/') absolute_project += "/";
  std::string absolute_filepath = PosixPath(AbsolutePath(filepath));

  // Find the first character where they disagree.
  // The previous directory is the lowest common ancestor;
  const char *a = absolute_project.c_str();
  const char *b = absolute_filepath.c_str();
  size_t common_prefix_len = 0;
  while (*a != '\0' && *b != '\0' && *a == *b) {
    if (*a == '/') common_prefix_len = a - absolute_project.c_str();
    a++;
    b++;
  }
  // the number of ../ to prepend to b depends on the number of remaining
  // directories in A.
  const char *suffix = absolute_project.c_str() + common_prefix_len;
  size_t num_up = 0;
  while (*suffix != '\0')
    if (*suffix++ == '/') num_up++;
  num_up--;  // last one is known to be '/'.
  std::string result = "//";
  for (size_t i = 0; i < num_up; i++) result += "../";
  result += absolute_filepath.substr(common_prefix_len + 1);

  return result;
}